

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

bool boost::ext::ut::v1_1_8::detail::on<bool,boost::ext::ut::v1_1_8::events::assertion<bool>>
               (assertion<bool> *event)

{
  assertion<bool> assertion;
  bool bVar1;
  runner<ApprovalTests::cfg::reporter,_16> *in_stack_00000018;
  undefined1 in_stack_00000038 [16];
  
  assertion.location = (source_location)in_stack_00000038;
  assertion._0_8_ = event;
  bVar1 = runner<ApprovalTests::cfg::reporter,_16>::on<bool>(in_stack_00000018,assertion);
  return bVar1;
}

Assistant:

[[nodiscard]] constexpr decltype(auto) on(TEvent&& event) {
  return ut::cfg<typename type_traits::identity<override, Ts...>::type>.on(
      static_cast<TEvent&&>(event));
}